

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

bool gl4cts::EnhancedLayouts::Utils::checkSSB
               (Program *program,Variable *variable,stringstream *stream)

{
  pointer pDVar1;
  Interface *pIVar2;
  Program *this;
  bool bVar3;
  GLuint index;
  long lVar4;
  ostream *poVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  TestError *this_00;
  long lVar7;
  ulong uVar8;
  byte bVar9;
  GLint offset;
  string name_str;
  GLint local_d4;
  stringstream *local_d0;
  string local_c8;
  undefined8 local_a8;
  string local_a0;
  Variable *local_80;
  long local_78;
  ulong local_70;
  Interface *local_68;
  Program *local_60;
  string *local_58;
  string local_50;
  
  local_d0 = stream;
  bVar3 = Variable::IsBlock(variable);
  if (!bVar3) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Not implemented",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0x4ca);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_68 = (variable->m_descriptor).field_9.m_interface;
  lVar4 = (long)(local_68->m_members).
                super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(local_68->m_members).
                super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar4 == 0) {
    bVar3 = true;
  }
  else {
    lVar4 = lVar4 >> 4;
    local_70 = lVar4 * 0x6db6db6db6db6db7;
    local_58 = &local_68->m_name;
    local_d0 = local_d0 + 0x10;
    lVar7 = 0;
    local_78 = lVar4 * -0x6db6db6db6db6db7 - (ulong)(local_70 == 0);
    bVar9 = 1;
    uVar8 = 1;
    local_a8 = 0;
    local_80 = variable;
    local_60 = program;
    do {
      this = local_60;
      pIVar2 = local_68;
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,0x1aee929);
      local_d4 = 0;
      Variable::GetReference
                (&local_a0,local_58,
                 (Descriptor *)
                 ((long)&((pIVar2->m_members).
                          super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_expected_component + lVar7),
                 BASIC,0);
      pDVar1 = (pIVar2->m_members).
               super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(int *)((long)&pDVar1->m_type + lVar7) == 1) {
        Variable::GetReference
                  (&local_50,&local_a0,
                   (Descriptor *)**(undefined8 **)((long)&pDVar1->field_9 + lVar7),BASIC,0);
        std::__cxx11::string::_M_assign((string *)&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::__cxx11::string::_M_assign((string *)&local_c8);
      }
      index = Program::GetResourceIndex(this,&local_c8,0x92e5);
      Program::GetResource(this,0x92e5,index,0x92fc,1,&local_d4);
      pDVar1 = (pIVar2->m_members).
               super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_d4 != *(int *)((long)&pDVar1->m_offset + lVar7)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d0,"Uniform: ",9);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_d0,
                            *(char **)((long)&(pDVar1->m_name)._M_dataplus + lVar7),
                            *(long *)((long)&(pDVar1->m_name)._M_string_length + lVar7));
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," - invalid offset: ",0x13);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_d4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," expected: ",0xb);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        bVar9 = 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      paVar6 = &local_c8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar6) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        paVar6 = extraout_RAX;
      }
      bVar3 = local_70 <= uVar8;
      local_a8 = CONCAT71((int7)((ulong)paVar6 >> 8),bVar3);
      lVar4 = local_78 + uVar8;
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x70;
    } while (lVar4 != 0);
    bVar3 = (bool)(bVar3 & bVar9);
  }
  return bVar3;
}

Assistant:

bool checkSSB(Program& program, const Utils::Variable& variable, std::stringstream& stream)
{
	bool result = true;

	if (false == variable.IsBlock())
	{
		TCU_FAIL("Not implemented");
	}
	else
	{
		Utils::Interface* interface = variable.m_descriptor.m_interface;

		size_t size = interface->m_members.size();

		for (size_t i = 0; i < size; ++i)
		{
			GLuint		index	= 0;
			std::string name_str = "";
			GLint		offset   = 0;

			const std::string& name =
				Utils::Variable::GetReference(interface->m_name, interface->m_members[i], Utils::Variable::BASIC, 0);

			if (Utils::Variable::INTERFACE == interface->m_members[i].m_type)
			{
				const std::string& member_name = Utils::Variable::GetReference(
					name, interface->m_members[i].m_interface->m_members[0], Utils::Variable::BASIC, 0);

				name_str = member_name;
			}
			else
			{
				name_str = name;
			}

			try
			{
				index = program.GetResourceIndex(name_str, GL_BUFFER_VARIABLE);

				program.GetResource(GL_BUFFER_VARIABLE, index, GL_OFFSET, 1, &offset);
			}
			catch (std::exception& exc)
			{
				stream << "Failed to query program for buffer variable: " << variable.m_descriptor.m_name
					   << ". Reason: " << exc.what() << "\n";

				return false;
			}

			Utils::Variable::Descriptor& desc = interface->m_members[i];

			if (offset != (GLint)desc.m_offset)
			{
				stream << "Uniform: " << desc.m_name << " - invalid offset: " << offset
					   << " expected: " << desc.m_offset << std::endl;
				result = false;
			}
		}
	}

	return result;
}